

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,version v)

{
  if (v < (es5|es3)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,*(char **)(&DAT_001dcca0 + (ulong)v * 8),3);
    return os;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/version.cpp",
                0xe,
                "std::basic_ostream<CharT> &mjs::operator<<(std::basic_ostream<CharT> &, version) [CharT = char]"
               );
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, version v) {
    switch (v) {
    case version::es1:      return os << "ES1";
    case version::es3:      return os << "ES3";
    case version::es5:      return os << "ES5";
    }
    assert(false);
    return os << "version{" << (int)v << "}";
}